

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int * get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  vrna_param_t *pvVar1;
  int *piVar2;
  int *piVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *local_a8;
  code *local_90;
  code *local_88;
  char *local_68;
  
  lVar12 = (long)j;
  piVar10 = (int *)vrna_alloc(j * 4);
  pvVar1 = fc->params;
  piVar2 = fc->jindx;
  piVar3 = (fc->matrices->field_2).field_0.c;
  uVar9 = (pvVar1->model_details).min_loop_size;
  uVar5 = ~uVar9 + j;
  uVar15 = (ulong)uVar5;
  iVar6 = uVar5 + piVar2[lVar12];
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_a8 = (fc->field_23).field_0.ptype;
    local_90 = (code *)sc_wrapper->red_stem;
    local_88 = (code *)sc_wrapper->decomp_stem;
    local_68 = (char *)0x0;
    uVar11 = 1;
    for (lVar16 = 0; iVar8 = (int)lVar16, 1 < (int)(iVar8 + uVar5); lVar16 = lVar16 + -1) {
      piVar10[uVar15 + lVar16] = 10000000;
      if (piVar3[iVar6 + lVar16] != 10000000) {
        uVar4 = (*evaluate)(1,j,iVar8 + (j - uVar9) + -2,iVar8 + uVar5,'\x12',hc_dat_local);
        if (uVar4 != '\0') {
          piVar10[uVar15 + lVar16] = piVar3[iVar6 + lVar16];
          uVar7 = vrna_get_ptype(iVar6 + iVar8,local_a8);
          iVar8 = 0;
          if (2 < uVar7) {
            iVar8 = pvVar1->TerminalAU;
          }
          piVar10[uVar15 + lVar16] = piVar10[uVar15 + lVar16] + iVar8;
        }
      }
    }
  }
  else {
    uVar11 = (fc->field_23).field_1.n_seq;
    local_68 = (fc->field_23).field_0.ptype_pf_compat;
    local_90 = (code *)sc_wrapper->red_stem;
    local_88 = (code *)sc_wrapper->decomp_stem;
    if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      lVar16 = (long)iVar6;
      local_a8 = (char *)0x0;
      for (uVar14 = uVar15; iVar6 = (int)uVar14, 1 < iVar6; uVar14 = uVar14 - 1) {
        piVar10[uVar14] = 10000000;
        if ((piVar3[lVar16] != 10000000) &&
           (uVar4 = (*evaluate)(1,j,iVar6 + -1,iVar6,'\x12',hc_dat_local), uVar4 != '\0')) {
          piVar10[uVar14] = piVar3[lVar16];
          for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
            uVar5 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_68 + uVar13 * 8) + uVar14 * 2)
                                      ,(int)*(short *)(*(long *)(local_68 + uVar13 * 8) + lVar12 * 2
                                                      ),&pvVar1->model_details);
            iVar6 = 0;
            if (2 < uVar5) {
              iVar6 = pvVar1->TerminalAU;
            }
            piVar10[uVar14] = piVar10[uVar14] + iVar6;
          }
        }
        lVar16 = lVar16 + -1;
      }
    }
    else {
      local_a8 = (char *)0x0;
    }
  }
  if (local_88 != (code *)0x0) {
    iVar6 = (j - uVar9) + -2;
    for (; 1 < (int)uVar15; uVar15 = uVar15 - 1) {
      if (piVar10[uVar15] != 10000000) {
        iVar8 = (*local_88)(j,iVar6,uVar15 & 0xffffffff,sc_wrapper);
        piVar10[uVar15] = piVar10[uVar15] + iVar8;
      }
      iVar6 = iVar6 + -1;
    }
  }
  piVar10[1] = 10000000;
  iVar6 = piVar2[lVar12];
  if ((piVar3[(long)iVar6 + 1] != 10000000) &&
     (uVar4 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar4 != '\0')) {
    piVar10[1] = piVar3[(long)iVar6 + 1];
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      uVar9 = vrna_get_ptype(iVar6 + 1,local_a8);
      iVar6 = 0;
      if (2 < uVar9) {
        iVar6 = pvVar1->TerminalAU;
      }
      piVar10[1] = piVar10[1] + iVar6;
    }
    else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
        uVar9 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_68 + uVar15 * 8) + 2),
                                  (int)*(short *)(*(long *)(local_68 + uVar15 * 8) + lVar12 * 2),
                                  &pvVar1->model_details);
        iVar6 = 0;
        if (2 < uVar9) {
          iVar6 = pvVar1->TerminalAU;
        }
        piVar10[1] = piVar10[1] + iVar6;
      }
    }
    if (local_90 != (code *)0x0) {
      iVar6 = (*local_90)(j,1,j,sc_wrapper);
      piVar10[1] = piVar10[1] + iVar6;
    }
  }
  return piVar10;
}

Assistant:

int *
get_stem_contributions_d0(vrna_fold_compound_t      *fc,
                          int                       j,
                          vrna_callback_hc_evaluate *evaluate,
                          struct default_data       *hc_dat_local,
                          struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   **S;
  unsigned int            s, n_seq, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn - 1;
  ptype = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype : NULL;
  n_seq = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S     = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;

        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i]  = c[ij];
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];

          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(S[s][i], S[s][j], md);
            stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
          }
        }
      }
      break;
  }

  if (sc_spl_stem)
    for (i = j - turn - 1; i > 1; i--)
      if (stems[i] != INF)
        stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

  stems[1]  = INF;
  ij        = indx[j] + 1;

  if ((c[ij] != INF) &&
      (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
    stems[1] = c[ij];

    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(S[s][1], S[s][j], md);
          stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        }
        break;
    }

    if (sc_red_stem)
      stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
  }

  return stems;
}